

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O1

char * google::protobuf::ParsePackedField
                 (FieldDescriptor *field,Message *msg,Reflection *reflection,char *ptr,
                 ParseContext *ctx)

{
  RepeatedField<double> *object;
  RepeatedField<long> *pRVar1;
  char *pcVar2;
  RepeatedField<int> *pRVar3;
  RepeatedField<unsigned_long> *pRVar4;
  RepeatedField<float> *object_00;
  RepeatedField<bool> *object_01;
  void *object_02;
  RepeatedField<unsigned_int> *pRVar5;
  LogMessage *pLVar6;
  InternalMetadataWithArena *metadata;
  FieldDescriptor *local_80;
  EnumDescriptor *local_78;
  FieldDescriptor *local_70;
  LogMessage local_68;
  
  if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
    local_68._0_8_ = FieldDescriptor::TypeOnceInit;
    local_80 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&local_68,&local_80)
    ;
  }
  switch(*(undefined4 *)(field + 0x38)) {
  case 1:
    object = Reflection::MutableRepeatedField<double>(reflection,msg,field);
    pcVar2 = internal::PackedDoubleParser(object,ptr,ctx);
    break;
  case 2:
    object_00 = Reflection::MutableRepeatedField<float>(reflection,msg,field);
    pcVar2 = internal::PackedFloatParser(object_00,ptr,ctx);
    break;
  case 3:
    pRVar1 = Reflection::MutableRepeatedField<long>(reflection,msg,field);
    pcVar2 = internal::PackedInt64Parser(pRVar1,ptr,ctx);
    break;
  case 4:
    pRVar4 = Reflection::MutableRepeatedField<unsigned_long>(reflection,msg,field);
    pcVar2 = internal::PackedUInt64Parser(pRVar4,ptr,ctx);
    break;
  case 5:
    pRVar3 = Reflection::MutableRepeatedField<int>(reflection,msg,field);
    pcVar2 = internal::PackedInt32Parser(pRVar3,ptr,ctx);
    break;
  case 6:
    pRVar4 = Reflection::MutableRepeatedField<unsigned_long>(reflection,msg,field);
    pcVar2 = internal::PackedFixed64Parser(pRVar4,ptr,ctx);
    break;
  case 7:
    pRVar5 = Reflection::MutableRepeatedField<unsigned_int>(reflection,msg,field);
    pcVar2 = internal::PackedFixed32Parser(pRVar5,ptr,ctx);
    break;
  case 8:
    object_01 = Reflection::MutableRepeatedField<bool>(reflection,msg,field);
    pcVar2 = internal::PackedBoolParser(object_01,ptr,ctx);
    break;
  default:
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/message.cc"
               ,0x115);
    pLVar6 = internal::LogMessage::operator<<(&local_68,"Type is not packable ");
    if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
      local_80 = (FieldDescriptor *)FieldDescriptor::TypeOnceInit;
      local_70 = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&local_80,
                 &local_70);
    }
    pLVar6 = internal::LogMessage::operator<<(pLVar6,*(int *)(field + 0x38));
    internal::LogFinisher::operator=((LogFinisher *)&local_80,pLVar6);
    internal::LogMessage::~LogMessage(&local_68);
    pcVar2 = (char *)0x0;
    break;
  case 0xd:
    pRVar5 = Reflection::MutableRepeatedField<unsigned_int>(reflection,msg,field);
    pcVar2 = internal::PackedUInt32Parser(pRVar5,ptr,ctx);
    break;
  case 0xe:
    object_02 = Reflection::MutableRawRepeatedField
                          (reflection,msg,field,CPPTYPE_ENUM,0,(Descriptor *)0x0);
    if (*(int *)(*(long *)(field + 0x28) + 0x3c) == 3) {
      pcVar2 = internal::PackedEnumParser(object_02,ptr,ctx);
    }
    else {
      local_78 = FieldDescriptor::enum_type(field);
      metadata = Reflection::MutableInternalMetadataWithArena(reflection,msg);
      pcVar2 = internal::PackedEnumParserArg
                         (object_02,ptr,ctx,ReflectiveValidator,local_78,metadata,
                          *(int *)(field + 0x44));
    }
    break;
  case 0xf:
    pRVar3 = Reflection::MutableRepeatedField<int>(reflection,msg,field);
    pcVar2 = internal::PackedSFixed32Parser(pRVar3,ptr,ctx);
    break;
  case 0x10:
    pRVar1 = Reflection::MutableRepeatedField<long>(reflection,msg,field);
    pcVar2 = internal::PackedSFixed64Parser(pRVar1,ptr,ctx);
    break;
  case 0x11:
    pRVar3 = Reflection::MutableRepeatedField<int>(reflection,msg,field);
    pcVar2 = internal::PackedSInt32Parser(pRVar3,ptr,ctx);
    break;
  case 0x12:
    pRVar1 = Reflection::MutableRepeatedField<long>(reflection,msg,field);
    pcVar2 = internal::PackedSInt64Parser(pRVar1,ptr,ctx);
  }
  return pcVar2;
}

Assistant:

const char* ParsePackedField(const FieldDescriptor* field, Message* msg,
                             const Reflection* reflection, const char* ptr,
                             internal::ParseContext* ctx) {
  switch (field->type()) {
#define HANDLE_PACKED_TYPE(TYPE, CPPTYPE, METHOD_NAME) \
  case FieldDescriptor::TYPE_##TYPE:                   \
    return internal::Packed##METHOD_NAME##Parser(      \
        reflection->MutableRepeatedField<CPPTYPE>(msg, field), ptr, ctx)
    HANDLE_PACKED_TYPE(INT32, int32, Int32);
    HANDLE_PACKED_TYPE(INT64, int64, Int64);
    HANDLE_PACKED_TYPE(SINT32, int32, SInt32);
    HANDLE_PACKED_TYPE(SINT64, int64, SInt64);
    HANDLE_PACKED_TYPE(UINT32, uint32, UInt32);
    HANDLE_PACKED_TYPE(UINT64, uint64, UInt64);
    HANDLE_PACKED_TYPE(BOOL, bool, Bool);
    case FieldDescriptor::TYPE_ENUM: {
      auto object =
          internal::ReflectionAccessor::GetRepeatedEnum(reflection, field, msg);
      if (field->file()->syntax() == FileDescriptor::SYNTAX_PROTO3) {
        return internal::PackedEnumParser(object, ptr, ctx);
      } else {
        return internal::PackedEnumParserArg(
            object, ptr, ctx, ReflectiveValidator, field->enum_type(),
            internal::ReflectionAccessor::MutableInternalMetadataWithArena(
                reflection, msg),
            field->number());
      }
    }
      HANDLE_PACKED_TYPE(FIXED32, uint32, Fixed32);
      HANDLE_PACKED_TYPE(FIXED64, uint64, Fixed64);
      HANDLE_PACKED_TYPE(SFIXED32, int32, SFixed32);
      HANDLE_PACKED_TYPE(SFIXED64, int64, SFixed64);
      HANDLE_PACKED_TYPE(FLOAT, float, Float);
      HANDLE_PACKED_TYPE(DOUBLE, double, Double);
#undef HANDLE_PACKED_TYPE

    default:
      GOOGLE_LOG(FATAL) << "Type is not packable " << field->type();
      return nullptr;  // Make compiler happy
  }
}